

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage3_avx2(__m256i *x2,__m256i *x3,__m256i *cospi_m32,__m256i *cospi_p32,
                       __m256i *__rounding,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  char in_R9B;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  
  auVar1 = vpaddd_avx2(*in_RDI,in_RDI[0xf]);
  *in_RSI = auVar1;
  auVar1 = vpsubd_avx2(*in_RDI,in_RDI[0xf]);
  in_RSI[0xf] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[1],in_RDI[0xe]);
  in_RSI[1] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[1],in_RDI[0xe]);
  in_RSI[0xe] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[2],in_RDI[0xd]);
  in_RSI[2] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[2],in_RDI[0xd]);
  in_RSI[0xd] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[3],in_RDI[0xc]);
  in_RSI[3] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[3],in_RDI[0xc]);
  in_RSI[0xc] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[4],in_RDI[0xb]);
  in_RSI[4] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[4],in_RDI[0xb]);
  in_RSI[0xb] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[5],in_RDI[10]);
  in_RSI[5] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[5],in_RDI[10]);
  in_RSI[10] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[6],in_RDI[9]);
  in_RSI[6] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[6],in_RDI[9]);
  in_RSI[9] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[7],in_RDI[8]);
  in_RSI[7] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[7],in_RDI[8]);
  in_RSI[8] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x10] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x10] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x10] + 0x18);
  *(undefined8 *)in_RSI[0x10] = *(undefined8 *)in_RDI[0x10];
  *(undefined8 *)(in_RSI[0x10] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x10] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x10] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x11] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x11] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x11] + 0x18);
  *(undefined8 *)in_RSI[0x11] = *(undefined8 *)in_RDI[0x11];
  *(undefined8 *)(in_RSI[0x11] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x11] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x11] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x12] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x12] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x12] + 0x18);
  *(undefined8 *)in_RSI[0x12] = *(undefined8 *)in_RDI[0x12];
  *(undefined8 *)(in_RSI[0x12] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x12] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x12] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x13] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x13] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x13] + 0x18);
  *(undefined8 *)in_RSI[0x13] = *(undefined8 *)in_RDI[0x13];
  *(undefined8 *)(in_RSI[0x13] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x13] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x13] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[0x14],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x1b],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x14] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x14],*in_R8);
  in_RSI[0x14] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x14],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x14] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x14],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x1b],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x1b],*in_R8);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x1b],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x1b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x15],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x1a],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x15] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x15],*in_R8);
  in_RSI[0x15] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x15],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x15] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x15],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x1a],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x1a],*in_R8);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x1a],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x1a] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x16],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x19],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x16] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x16],*in_R8);
  in_RSI[0x16] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x16],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x16] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x16],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x19],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x19] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x19],*in_R8);
  in_RSI[0x19] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x19],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x19] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x17],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x18],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x17] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x17],*in_R8);
  in_RSI[0x17] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x17],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x17] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x17],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x18],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x18] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x18],*in_R8);
  in_RSI[0x18] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x18],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x18] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x1c] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x1c] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x1c] + 0x18);
  *(undefined8 *)in_RSI[0x1c] = *(undefined8 *)in_RDI[0x1c];
  *(undefined8 *)(in_RSI[0x1c] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x1c] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x1c] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x1d] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x1d] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x1d] + 0x18);
  *(undefined8 *)in_RSI[0x1d] = *(undefined8 *)in_RDI[0x1d];
  *(undefined8 *)(in_RSI[0x1d] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x1d] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x1d] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x1e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x1e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x1e] + 0x18);
  *(undefined8 *)in_RSI[0x1e] = *(undefined8 *)in_RDI[0x1e];
  *(undefined8 *)(in_RSI[0x1e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x1e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x1e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x1f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x1f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x1f] + 0x18);
  *(undefined8 *)in_RSI[0x1f] = *(undefined8 *)in_RDI[0x1f];
  *(undefined8 *)(in_RSI[0x1f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x1f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x1f] + 0x18) = uVar5;
  auVar1 = vpaddd_avx2(in_RDI[0x20],in_RDI[0x2f]);
  in_RSI[0x20] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x20],in_RDI[0x2f]);
  in_RSI[0x2f] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x21],in_RDI[0x2e]);
  in_RSI[0x21] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x21],in_RDI[0x2e]);
  in_RSI[0x2e] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x22],in_RDI[0x2d]);
  in_RSI[0x22] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x22],in_RDI[0x2d]);
  in_RSI[0x2d] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x23],in_RDI[0x2c]);
  in_RSI[0x23] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x23],in_RDI[0x2c]);
  in_RSI[0x2c] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x24],in_RDI[0x2b]);
  in_RSI[0x24] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x24],in_RDI[0x2b]);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x25],in_RDI[0x2a]);
  in_RSI[0x25] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x25],in_RDI[0x2a]);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x26],in_RDI[0x29]);
  in_RSI[0x26] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x26],in_RDI[0x29]);
  in_RSI[0x29] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x27],in_RDI[0x28]);
  in_RSI[0x27] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x27],in_RDI[0x28]);
  in_RSI[0x28] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3f],in_RDI[0x30]);
  in_RSI[0x30] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3f],in_RDI[0x30]);
  in_RSI[0x3f] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3e],in_RDI[0x31]);
  in_RSI[0x31] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3e],in_RDI[0x31]);
  in_RSI[0x3e] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3d],in_RDI[0x32]);
  in_RSI[0x32] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3d],in_RDI[0x32]);
  in_RSI[0x3d] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3c],in_RDI[0x33]);
  in_RSI[0x33] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3c],in_RDI[0x33]);
  in_RSI[0x3c] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3b],in_RDI[0x34]);
  in_RSI[0x34] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3b],in_RDI[0x34]);
  in_RSI[0x3b] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3a],in_RDI[0x35]);
  in_RSI[0x35] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3a],in_RDI[0x35]);
  in_RSI[0x3a] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x39],in_RDI[0x36]);
  in_RSI[0x36] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x39],in_RDI[0x36]);
  in_RSI[0x39] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x38],in_RDI[0x37]);
  in_RSI[0x37] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x38],in_RDI[0x37]);
  in_RSI[0x38] = auVar1;
  return;
}

Assistant:

static inline void fdct64_stage3_avx2(__m256i *x2, __m256i *x3,
                                      __m256i *cospi_m32, __m256i *cospi_p32,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  x3[0] = _mm256_add_epi32(x2[0], x2[15]);
  x3[15] = _mm256_sub_epi32(x2[0], x2[15]);
  x3[1] = _mm256_add_epi32(x2[1], x2[14]);
  x3[14] = _mm256_sub_epi32(x2[1], x2[14]);
  x3[2] = _mm256_add_epi32(x2[2], x2[13]);
  x3[13] = _mm256_sub_epi32(x2[2], x2[13]);
  x3[3] = _mm256_add_epi32(x2[3], x2[12]);
  x3[12] = _mm256_sub_epi32(x2[3], x2[12]);
  x3[4] = _mm256_add_epi32(x2[4], x2[11]);
  x3[11] = _mm256_sub_epi32(x2[4], x2[11]);
  x3[5] = _mm256_add_epi32(x2[5], x2[10]);
  x3[10] = _mm256_sub_epi32(x2[5], x2[10]);
  x3[6] = _mm256_add_epi32(x2[6], x2[9]);
  x3[9] = _mm256_sub_epi32(x2[6], x2[9]);
  x3[7] = _mm256_add_epi32(x2[7], x2[8]);
  x3[8] = _mm256_sub_epi32(x2[7], x2[8]);
  x3[16] = x2[16];
  x3[17] = x2[17];
  x3[18] = x2[18];
  x3[19] = x2[19];
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x2[20], x2[27], x3[20], x3[27],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x2[21], x2[26], x3[21], x3[26],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x2[22], x2[25], x3[22], x3[25],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x2[23], x2[24], x3[23], x3[24],
                        *__rounding, cos_bit);
  x3[28] = x2[28];
  x3[29] = x2[29];
  x3[30] = x2[30];
  x3[31] = x2[31];
  x3[32] = _mm256_add_epi32(x2[32], x2[47]);
  x3[47] = _mm256_sub_epi32(x2[32], x2[47]);
  x3[33] = _mm256_add_epi32(x2[33], x2[46]);
  x3[46] = _mm256_sub_epi32(x2[33], x2[46]);
  x3[34] = _mm256_add_epi32(x2[34], x2[45]);
  x3[45] = _mm256_sub_epi32(x2[34], x2[45]);
  x3[35] = _mm256_add_epi32(x2[35], x2[44]);
  x3[44] = _mm256_sub_epi32(x2[35], x2[44]);
  x3[36] = _mm256_add_epi32(x2[36], x2[43]);
  x3[43] = _mm256_sub_epi32(x2[36], x2[43]);
  x3[37] = _mm256_add_epi32(x2[37], x2[42]);
  x3[42] = _mm256_sub_epi32(x2[37], x2[42]);
  x3[38] = _mm256_add_epi32(x2[38], x2[41]);
  x3[41] = _mm256_sub_epi32(x2[38], x2[41]);
  x3[39] = _mm256_add_epi32(x2[39], x2[40]);
  x3[40] = _mm256_sub_epi32(x2[39], x2[40]);
  x3[48] = _mm256_sub_epi32(x2[63], x2[48]);
  x3[63] = _mm256_add_epi32(x2[63], x2[48]);
  x3[49] = _mm256_sub_epi32(x2[62], x2[49]);
  x3[62] = _mm256_add_epi32(x2[62], x2[49]);
  x3[50] = _mm256_sub_epi32(x2[61], x2[50]);
  x3[61] = _mm256_add_epi32(x2[61], x2[50]);
  x3[51] = _mm256_sub_epi32(x2[60], x2[51]);
  x3[60] = _mm256_add_epi32(x2[60], x2[51]);
  x3[52] = _mm256_sub_epi32(x2[59], x2[52]);
  x3[59] = _mm256_add_epi32(x2[59], x2[52]);
  x3[53] = _mm256_sub_epi32(x2[58], x2[53]);
  x3[58] = _mm256_add_epi32(x2[58], x2[53]);
  x3[54] = _mm256_sub_epi32(x2[57], x2[54]);
  x3[57] = _mm256_add_epi32(x2[57], x2[54]);
  x3[55] = _mm256_sub_epi32(x2[56], x2[55]);
  x3[56] = _mm256_add_epi32(x2[56], x2[55]);
}